

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrNodeQNameValue
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaBasicItemPtr ownerItem,
              xmlAttrPtr attr,xmlChar *value,xmlChar **uri,xmlChar **local)

{
  xmlAttrPtr pxVar1;
  xmlSchemaPtr pxVar2;
  int iVar3;
  xmlSchemaTypePtr pxVar4;
  char *pcVar5;
  xmlChar *pxVar6;
  int local_54;
  int ret;
  int len;
  xmlNsPtr ns;
  xmlChar *pref;
  xmlChar **uri_local;
  xmlChar *value_local;
  xmlAttrPtr attr_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  *uri = (xmlChar *)0x0;
  *local = (xmlChar *)0x0;
  pref = (xmlChar *)uri;
  uri_local = (xmlChar **)value;
  value_local = (xmlChar *)attr;
  attr_local = (xmlAttrPtr)ownerItem;
  ownerItem_local = (xmlSchemaBasicItemPtr)schema;
  schema_local = (xmlSchemaPtr)ctxt;
  iVar3 = xmlValidateQName(value,1);
  pxVar2 = schema_local;
  pxVar1 = attr_local;
  pxVar6 = value_local;
  if (iVar3 < 1) {
    if (iVar3 < 0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      pcVar5 = strchr((char *)uri_local,0x3a);
      if (pcVar5 == (char *)0x0) {
        _ret = xmlSearchNs(*(xmlDocPtr *)(value_local + 0x40),*(xmlNodePtr *)(value_local + 0x28),
                           (xmlChar *)0x0);
        if (((_ret == (xmlNsPtr)0x0) || (_ret->href == (xmlChar *)0x0)) || (*_ret->href == '\0')) {
          if ((ownerItem_local[3].type & 0x200) != 0) {
            *(xmlSchemaAnnotPtr *)pref = schema_local[1].annot;
          }
        }
        else {
          pxVar6 = xmlDictLookup((xmlDictPtr)schema_local->volatiles,_ret->href,-1);
          *(xmlChar **)pref = pxVar6;
        }
        pxVar6 = xmlDictLookup((xmlDictPtr)schema_local->volatiles,(xmlChar *)uri_local,-1);
        *local = pxVar6;
        ctxt_local._4_4_ = 0;
      }
      else {
        pxVar6 = xmlSplitQName3((xmlChar *)uri_local,&local_54);
        *local = pxVar6;
        pxVar6 = xmlDictLookup((xmlDictPtr)schema_local->volatiles,*local,-1);
        *local = pxVar6;
        ns = (xmlNsPtr)
             xmlDictLookup((xmlDictPtr)schema_local->volatiles,(xmlChar *)uri_local,local_54);
        _ret = xmlSearchNs(*(xmlDocPtr *)(value_local + 0x40),*(xmlNodePtr *)(value_local + 0x28),
                           (xmlChar *)ns);
        pxVar2 = schema_local;
        pxVar1 = attr_local;
        pxVar6 = value_local;
        if (_ret == (xmlNsPtr)0x0) {
          pxVar4 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
          xmlSchemaPSimpleTypeErr
                    ((xmlSchemaParserCtxtPtr)pxVar2,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                     (xmlSchemaBasicItemPtr)pxVar1,(xmlNodePtr)pxVar6,pxVar4,(char *)0x0,
                     (xmlChar *)uri_local,
                     "The value \'%s\' of simple type \'xs:QName\' has no corresponding namespace declaration in scope"
                     ,(xmlChar *)uri_local,(xmlChar *)0x0);
          ctxt_local._4_4_ = *(int *)&schema_local->doc;
        }
        else {
          pxVar6 = xmlDictLookup((xmlDictPtr)schema_local->volatiles,_ret->href,-1);
          *(xmlChar **)pref = pxVar6;
          ctxt_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    pxVar4 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
    xmlSchemaPSimpleTypeErr
              ((xmlSchemaParserCtxtPtr)pxVar2,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
               (xmlSchemaBasicItemPtr)pxVar1,(xmlNodePtr)pxVar6,pxVar4,(char *)0x0,
               (xmlChar *)uri_local,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    *local = (xmlChar *)uri_local;
    ctxt_local._4_4_ = *(int *)&schema_local->doc;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrNodeQNameValue(xmlSchemaParserCtxtPtr ctxt,
				       xmlSchemaPtr schema,
				       xmlSchemaBasicItemPtr ownerItem,
				       xmlAttrPtr attr,
				       const xmlChar *value,
				       const xmlChar **uri,
				       const xmlChar **local)
{
    const xmlChar *pref;
    xmlNsPtr ns;
    int len, ret;

    *uri = NULL;
    *local = NULL;
    ret = xmlValidateQName(value, 1);
    if (ret > 0) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    ownerItem, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME),
	    NULL, value, NULL, NULL, NULL);
	*local = value;
	return (ctxt->err);
    } else if (ret < 0)
	return (-1);

    if (!strchr((char *) value, ':')) {
	ns = xmlSearchNs(attr->doc, attr->parent, NULL);
	if (ns && ns->href && ns->href[0])
	    *uri = xmlDictLookup(ctxt->dict, ns->href, -1);
	else if (schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) {
	    /* TODO: move XML_SCHEMAS_INCLUDING_CONVERT_NS to the
	    * parser context. */
	    /*
	    * This one takes care of included schemas with no
	    * target namespace.
	    */
	    *uri = ctxt->targetNamespace;
	}
	*local = xmlDictLookup(ctxt->dict, value, -1);
	return (0);
    }
    /*
    * At this point xmlSplitQName3 has to return a local name.
    */
    *local = xmlSplitQName3(value, &len);
    *local = xmlDictLookup(ctxt->dict, *local, -1);
    pref = xmlDictLookup(ctxt->dict, value, len);
    ns = xmlSearchNs(attr->doc, attr->parent, pref);
    if (ns == NULL) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    ownerItem, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME), NULL, value,
	    "The value '%s' of simple type 'xs:QName' has no "
	    "corresponding namespace declaration in scope", value, NULL);
	return (ctxt->err);
    } else {
        *uri = xmlDictLookup(ctxt->dict, ns->href, -1);
    }
    return (0);
}